

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

bool __thiscall
QDateTimeParser::fromString(QDateTimeParser *this,QString *t,QDate *date,QTime *time,int baseYear)

{
  bool bVar1;
  time_t tVar2;
  QDate this_00;
  QDateTimeParser *in_RCX;
  qint64 *in_RDX;
  time_t *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QDate d;
  QTime t_1;
  StateNode tmp;
  QDateTime *in_stack_000000b8;
  int in_stack_000000c4;
  QString *in_stack_000000c8;
  QDateTimeParser *in_stack_000000d0;
  Initialization in_stack_ffffffffffffff3c;
  QTimeZone *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  undefined4 in_stack_ffffffffffffff88;
  bool local_49;
  QTime local_3c [5];
  Data local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)((long)in_RDI + 0xc) = in_R8D;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (QDateTimePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTimeZone::QTimeZone(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  baseDate(in_RCX,(QTimeZone *)CONCAT44(in_R8D,in_stack_ffffffffffffff88));
  parse(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000b8,(bool)tmp._23_1_);
  QDateTime::~QDateTime((QDateTime *)0x775d97);
  QTimeZone::~QTimeZone((QTimeZone *)0x775da4);
  if (((int)puStack_20 == 2) && (((ulong)local_18 & 1) == 0)) {
    if (in_RCX != (QDateTimeParser *)0x0) {
      local_3c[0].mds = -0x55555556;
      tVar2 = QDateTime::time((QDateTime *)&local_28.data,in_RDI);
      local_3c[0].mds = (int)tVar2;
      bVar1 = QTime::isValid(local_3c);
      if (!bVar1) {
        local_49 = false;
        goto LAB_00775f29;
      }
      *(int *)&in_RCX->_vptr_QDateTimeParser = local_3c[0].mds;
    }
    if (in_RDX != (qint64 *)0x0) {
      this_00 = QDateTime::date((QDateTime *)
                                CONCAT17(in_stack_ffffffffffffff4f,
                                         CONCAT16(in_stack_ffffffffffffff4e,
                                                  in_stack_ffffffffffffff48)));
      bVar1 = QDate::isValid((QDate *)this_00.jd);
      if (!bVar1) {
        local_49 = false;
        goto LAB_00775f29;
      }
      *in_RDX = this_00.jd;
    }
    local_49 = true;
  }
  else {
    local_49 = false;
  }
LAB_00775f29:
  StateNode::~StateNode((StateNode *)0x775f36);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QDateTimeParser::fromString(const QString &t, QDate *date, QTime *time, int baseYear) const
{
    defaultCenturyStart = baseYear;
    const StateNode tmp = parse(t, -1, baseDate(QTimeZone::UTC), false);
    if (tmp.state != Acceptable || tmp.conflicts)
        return false;

    if (time) {
        Q_ASSERT(!date);
        const QTime t = tmp.value.time();
        if (!t.isValid())
            return false;
        *time = t;
    }

    if (date) {
        Q_ASSERT(!time);
        const QDate d = tmp.value.date();
        if (!d.isValid())
            return false;
        *date = d;
    }
    return true;
}